

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O2

EExpr * __thiscall
mp::
ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
::
VisitRelationalExpression<_1,std::initializer_list<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>>
          (EExpr *__return_storage_ptr__,
          ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
          *this,initializer_list<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_> ea)

{
  initializer_list<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_> ea_local;
  LinTerms local_c20;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> local_ba8;
  CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>_>_>
  local_b08;
  array<mp::EExpr,_2UL> ee;
  QuadAndLinTerms local_578;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> local_3c0;
  AlgebraicExpression<mp::QuadAndLinTerms> local_1e0;
  
  ea_local._M_len = ea._M_len;
  ea_local._M_array = ea._M_array;
  std::array<mp::EExpr,_2UL>::array(&ee);
  Exprs2EExprs<std::initializer_list<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>,2ul>
            (this,&ea_local,&ee);
  AlgebraicExpression<mp::QuadAndLinTerms>::AlgebraicExpression
            (&local_1e0,&ee._M_elems[1].super_QuadraticExpr);
  AlgebraicExpression<mp::QuadAndLinTerms>::subtract
            ((AlgebraicExpression<mp::QuadAndLinTerms> *)&ee,&local_1e0);
  QuadAndLinTerms::~QuadAndLinTerms(&local_1e0.super_QuadAndLinTerms);
  QuadAndLinTerms::sort_terms((QuadAndLinTerms *)&ee);
  if (ee._M_elems[0].super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.folded_.
      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_size
      == 0) {
    LinTerms::LinTerms(&local_c20,(LinTerms *)&ee);
    AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
              (&local_ba8,&local_c20,
               (AlgConRhs<_1>)
               (ee._M_elems[0].super_QuadraticExpr.constant_term_ ^ 0x8000000000000000),true);
    ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>_>::
    ConditionalConstraint
              ((ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_> *)
               &local_b08,&local_ba8);
    AssignResult2Args<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<_1>>>>
              (__return_storage_ptr__,this,
               (ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_> *)
               &local_b08);
    CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>_>_>
    ::~CustomFunctionalConstraint
              ((CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
                *)&local_b08);
    AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::~AlgebraicConstraint(&local_ba8);
    LinTerms::~LinTerms(&local_c20);
  }
  else {
    QuadAndLinTerms::QuadAndLinTerms(&local_578,(QuadAndLinTerms *)&ee);
    AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
              (&local_3c0,&local_578,
               (AlgConRhs<_1>)
               (ee._M_elems[0].super_QuadraticExpr.constant_term_ ^ 0x8000000000000000),true);
    ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>_>::
    ConditionalConstraint
              ((ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>_>
                *)&local_b08,&local_3c0);
    AssignResult2Args<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<_1>>>>
              (__return_storage_ptr__,this,
               (ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>_>
                *)&local_b08);
    CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>_>_>
    ::~CustomFunctionalConstraint(&local_b08);
    AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::~AlgebraicConstraint(&local_3c0);
    QuadAndLinTerms::~QuadAndLinTerms(&local_578);
  }
  std::array<mp::EExpr,_2UL>::~array(&ee);
  return __return_storage_ptr__;
}

Assistant:

EExpr VisitRelationalExpression(ExprArray ea) {
    std::array<EExpr, 2> ee;
    Exprs2EExprs(ea, ee);
    ee[0].subtract(std::move(ee[1]));
    auto& lhs = ee[0];
    lhs.sort_terms();                             // to catch duplicates
    if (lhs.is_affine())                          // no QP terms
      return AssignResult2Args(                   // add conditional linear constraint
            ConditionalConstraint< LinConRhs<comp_kind> >
            { { std::move(lhs.GetLinTerms()),
                -lhs.constant_term() } } );
    return AssignResult2Args(                     // add conditional quadratic constraint
            ConditionalConstraint< QuadConRhs<comp_kind> >
            { { std::move(lhs.GetAlgConBody()),
                -lhs.constant_term() } } );
  }